

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::WBClearBit(LargeHeapBlock *this,char *addr)

{
  AutoCriticalSection local_28;
  AutoCriticalSection autoCs;
  int iStack_18;
  uint index;
  char *addr_local;
  LargeHeapBlock *this_local;
  
  iStack_18 = (int)addr;
  autoCs.cs._4_4_ = (uint)(iStack_18 - *(int *)&(this->super_HeapBlock).address) >> 3;
  AutoCriticalSection::AutoCriticalSection(&local_28,&wbVerifyBitsLock);
  BVSparse<Memory::HeapAllocator>::Clear(&this->wbVerifyBits,autoCs.cs._4_4_);
  AutoCriticalSection::~AutoCriticalSection(&local_28);
  return;
}

Assistant:

void LargeHeapBlock::WBClearBit(char* addr)
{
    uint index = (uint)(addr - this->address) / sizeof(void*);
    AutoCriticalSection autoCs(&wbVerifyBitsLock);
    wbVerifyBits.Clear(index);
}